

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O2

sequence * toml::detail::syntax::utf8_4bytes(sequence *__return_storage_ptr__,spec *param_1)

{
  sequence sStack_118;
  sequence local_f8;
  sequence local_d8;
  either local_b8;
  character_in_range local_98;
  character_in_range local_88;
  character_in_range local_78;
  character local_68;
  character_in_range local_58;
  character_in_range local_48;
  character_in_range local_38;
  character local_28;
  
  local_28.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_0045b940;
  local_28.value_ = 0xf0;
  local_38.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_0045ba00;
  local_38.from_ = 0x90;
  local_38.to_ = 0xbf;
  sequence::sequence<toml::detail::character,toml::detail::character_in_range>
            (&local_d8,&local_28,&local_38);
  local_48.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_0045ba00;
  local_48.from_ = 0xf1;
  local_48.to_ = 0xf3;
  local_58.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_0045ba00;
  local_58.from_ = 0x80;
  local_58.to_ = 0xbf;
  sequence::sequence<toml::detail::character_in_range,toml::detail::character_in_range>
            (&local_f8,&local_48,&local_58);
  local_68.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_0045b940;
  local_68.value_ = 0xf4;
  local_78.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_0045ba00;
  local_78.from_ = 0x80;
  local_78.to_ = 0x8f;
  sequence::sequence<toml::detail::character,toml::detail::character_in_range>
            (&sStack_118,&local_68,&local_78);
  either::either<toml::detail::sequence,toml::detail::sequence,toml::detail::sequence>
            (&local_b8,&local_d8,&local_f8,&sStack_118);
  local_88.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_0045ba00;
  local_88.from_ = 0x80;
  local_88.to_ = 0xbf;
  local_98.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_0045ba00;
  local_98.from_ = 0x80;
  local_98.to_ = 0xbf;
  sequence::
  sequence<toml::detail::either,toml::detail::character_in_range,toml::detail::character_in_range>
            (__return_storage_ptr__,&local_b8,&local_88,&local_98);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_b8.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&sStack_118.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_f8.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_d8.others_);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE sequence utf8_4bytes(const spec&)
{
    return sequence(/*1~2 bytes = */either(
        sequence(character         (0xF0),       character_in_range(0x90, 0xBF)),
        sequence(character_in_range(0xF1, 0xF3), character_in_range(0x80, 0xBF)),
        sequence(character         (0xF4),       character_in_range(0x80, 0x8F))
    ), character_in_range(0x80, 0xBF), character_in_range(0x80, 0xBF));
}